

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtlskey_openssl.cpp
# Opt level: O1

void __thiscall QTlsPrivate::TlsKeyOpenSSL::clear(TlsKeyOpenSSL *this,bool deep)

{
  (this->super_TlsKeyBase).keyIsNull = true;
  if (((this->super_TlsKeyBase).keyAlgorithm == Rsa) && ((this->field_0).rsa != (RSA *)0x0)) {
    if (deep) {
      q_RSA_free((this->field_0).rsa);
    }
    (this->field_0).opaque = (EVP_PKEY *)0x0;
  }
  if (((this->super_TlsKeyBase).keyAlgorithm == Dsa) && ((this->field_0).dsa != (DSA *)0x0)) {
    if (deep) {
      q_DSA_free((this->field_0).dsa);
    }
    (this->field_0).opaque = (EVP_PKEY *)0x0;
  }
  if (((this->super_TlsKeyBase).keyAlgorithm == Dh) && ((this->field_0).dh != (DH *)0x0)) {
    if (deep) {
      q_DH_free((this->field_0).dh);
    }
    (this->field_0).opaque = (EVP_PKEY *)0x0;
  }
  if (((this->super_TlsKeyBase).keyAlgorithm == Ec) && ((this->field_0).ec != (EC_KEY *)0x0)) {
    if (deep) {
      q_EC_KEY_free((this->field_0).ec);
    }
    (this->field_0).opaque = (EVP_PKEY *)0x0;
  }
  if (((this->super_TlsKeyBase).keyAlgorithm == Opaque) &&
     ((this->field_0).opaque != (EVP_PKEY *)0x0)) {
    if (deep) {
      q_EVP_PKEY_free((this->field_0).opaque);
    }
    (this->field_0).opaque = (EVP_PKEY *)0x0;
  }
  if ((this->field_0).opaque != (EVP_PKEY *)0x0) {
    q_EVP_PKEY_free((this->field_0).opaque);
    (this->field_0).opaque = (EVP_PKEY *)0x0;
  }
  return;
}

Assistant:

void TlsKeyOpenSSL::clear(bool deep)
{
    keyIsNull = true;

#ifndef OPENSSL_NO_DEPRECATED_3_0
    if (algorithm() == QSsl::Rsa && rsa) {
        if (deep)
            q_RSA_free(rsa);
        rsa = nullptr;
    }
    if (algorithm() == QSsl::Dsa && dsa) {
        if (deep)
            q_DSA_free(dsa);
        dsa = nullptr;
    }
    if (algorithm() == QSsl::Dh && dh) {
        if (deep)
            q_DH_free(dh);
        dh = nullptr;
    }
#ifndef OPENSSL_NO_EC
    if (algorithm() == QSsl::Ec && ec) {
       if (deep)
            q_EC_KEY_free(ec);
       ec = nullptr;
    }
#endif
#endif // OPENSSL_NO_DEPRECATED_3_0

    if (algorithm() == QSsl::Opaque && opaque) {
        if (deep)
            q_EVP_PKEY_free(opaque);
        opaque = nullptr;
    }

    if (genericKey) {
        // None of the above cleared it. genericKey is either
        // initialised by PEM read operation, or from X509, and
        // we are the owners and not sharing. So we free it.
        q_EVP_PKEY_free(genericKey);
        genericKey = nullptr;
    }
}